

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O3

void __thiscall ChatWindow::messageReceived(ChatWindow *this,QString *sender,QString *text)

{
  QStandardItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  QString t;
  QFont boldFont;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  QString local_88;
  undefined1 local_70 [24];
  QFont local_58 [16];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_a8 = 0xffffffffffffffff;
  local_a0 = 0;
  uStack_98 = 0;
  iVar3 = (**(code **)(*(long *)this->m_chatModel + 0x78))();
  bVar2 = operator==(&this->m_lastUserName,sender);
  if (bVar2) {
    local_a8 = 0xffffffffffffffff;
    local_a0 = 0;
    uStack_98 = 0;
    (**(code **)(*(long *)this->m_chatModel + 0xf8))(this->m_chatModel,iVar3,1);
  }
  else {
    QString::operator=(&this->m_lastUserName,sender);
    QFont::QFont(local_58);
    QFont::setWeight((Weight)local_58);
    local_a8 = 0xffffffffffffffff;
    local_a0 = 0;
    uStack_98 = 0;
    (**(code **)(*(long *)this->m_chatModel + 0xf8))(this->m_chatModel,iVar3,2);
    pQVar1 = this->m_chatModel;
    local_48 = 0xffffffffffffffff;
    local_40 = 0;
    uStack_38 = 0;
    (**(code **)(*(long *)pQVar1 + 0x60))(local_70,pQVar1,iVar3,0);
    local_88.d.d = (sender->d).d;
    local_88.d.ptr = (sender->d).ptr;
    local_88.d.size = (sender->d).size;
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QChar)(char16_t)&local_88);
    QVariant::QVariant((QVariant *)&local_a8,&local_88);
    (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_70,&local_a8,2);
    QVariant::~QVariant((QVariant *)&local_a8);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    pQVar1 = this->m_chatModel;
    local_48 = 0xffffffffffffffff;
    local_40 = 0;
    uStack_38 = 0;
    (**(code **)(*(long *)pQVar1 + 0x60))(local_70,pQVar1,iVar3,0);
    QVariant::QVariant((QVariant *)&local_a8,0x81);
    (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_70,&local_a8,7);
    QVariant::~QVariant((QVariant *)&local_a8);
    pQVar1 = this->m_chatModel;
    local_48 = 0xffffffffffffffff;
    local_40 = 0;
    uStack_38 = 0;
    (**(code **)(*(long *)pQVar1 + 0x60))(local_70,pQVar1,iVar3,0);
    QFont::operator_cast_to_QVariant((QFont *)&local_a8);
    (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_70,&local_a8,6);
    QVariant::~QVariant((QVariant *)&local_a8);
    iVar3 = iVar3 + 1;
    QFont::~QFont(local_58);
  }
  pQVar1 = this->m_chatModel;
  local_48 = 0xffffffffffffffff;
  local_40 = 0;
  uStack_38 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_70,pQVar1,iVar3,0);
  QVariant::QVariant((QVariant *)&local_a8,text);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_70,&local_a8,2);
  QVariant::~QVariant((QVariant *)&local_a8);
  pQVar1 = this->m_chatModel;
  local_48 = 0xffffffffffffffff;
  local_40 = 0;
  uStack_38 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_70,pQVar1,iVar3,0);
  QVariant::QVariant((QVariant *)&local_a8,0x81);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_70,&local_a8,7);
  QVariant::~QVariant((QVariant *)&local_a8);
  QAbstractItemView::scrollToBottom();
  return;
}

Assistant:

void ChatWindow::messageReceived(const QString &sender, const QString &text)
{
    // store the index of the new row to append to the model containing the messages
    int newRow = m_chatModel->rowCount();
    // we display a line containing the username only if it's different from the last username we displayed
    if (m_lastUserName != sender) {
        // store the last displayed username
        m_lastUserName = sender;
        // create a bold default font
        QFont boldFont;
        boldFont.setBold(true);
        // insert 2 row, one for the message and one for the username
        m_chatModel->insertRows(newRow, 2);
        // store the username in the model
        m_chatModel->setData(m_chatModel->index(newRow, 0), sender + QLatin1Char(':'));
        // set the alignment for the username
        m_chatModel->setData(m_chatModel->index(newRow, 0), int(Qt::AlignLeft | Qt::AlignVCenter), Qt::TextAlignmentRole);
        // set the for the username
        m_chatModel->setData(m_chatModel->index(newRow, 0), boldFont, Qt::FontRole);
        ++newRow;
    } else {
        // insert a row for the message
        m_chatModel->insertRow(newRow);
    }
    // store the message in the model
    m_chatModel->setData(m_chatModel->index(newRow, 0), text);
    // set the alignment for the message
    m_chatModel->setData(m_chatModel->index(newRow, 0), int(Qt::AlignLeft | Qt::AlignVCenter), Qt::TextAlignmentRole);
    // scroll the view to display the new message
    ui->chatView->scrollToBottom();
}